

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

DisableConstraintSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DisableConstraintSyntax,slang::parsing::Token&,slang::parsing::Token&,slang::syntax::ExpressionSyntax&,slang::parsing::Token&>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3)

{
  Info *pIVar1;
  Info *pIVar2;
  Info *pIVar3;
  TokenKind TVar4;
  undefined1 uVar5;
  NumericTokenFlags NVar6;
  uint32_t uVar7;
  TokenKind TVar8;
  undefined1 uVar9;
  NumericTokenFlags NVar10;
  uint32_t uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  DisableConstraintSyntax *pDVar16;
  
  pDVar16 = (DisableConstraintSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((DisableConstraintSyntax *)this->endPtr < pDVar16 + 1) {
    pDVar16 = (DisableConstraintSyntax *)allocateSlow(this,0x50,8);
  }
  else {
    this->head->current = (byte *)(pDVar16 + 1);
  }
  TVar4 = args->kind;
  uVar5 = args->field_0x2;
  NVar6.raw = (args->numFlags).raw;
  uVar7 = args->rawLen;
  pIVar1 = args->info;
  TVar8 = args_1->kind;
  uVar9 = args_1->field_0x2;
  NVar10.raw = (args_1->numFlags).raw;
  uVar11 = args_1->rawLen;
  pIVar2 = args_1->info;
  TVar12 = args_3->kind;
  uVar13 = args_3->field_0x2;
  NVar14.raw = (args_3->numFlags).raw;
  uVar15 = args_3->rawLen;
  pIVar3 = args_3->info;
  (pDVar16->super_ConstraintItemSyntax).super_SyntaxNode.kind = DisableConstraint;
  (pDVar16->super_ConstraintItemSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pDVar16->super_ConstraintItemSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pDVar16->disable).kind = TVar4;
  (pDVar16->disable).field_0x2 = uVar5;
  (pDVar16->disable).numFlags = (NumericTokenFlags)NVar6.raw;
  (pDVar16->disable).rawLen = uVar7;
  (pDVar16->disable).info = pIVar1;
  (pDVar16->soft).kind = TVar8;
  (pDVar16->soft).field_0x2 = uVar9;
  (pDVar16->soft).numFlags = (NumericTokenFlags)NVar10.raw;
  (pDVar16->soft).rawLen = uVar11;
  (pDVar16->soft).info = pIVar2;
  (pDVar16->name).ptr = args_2;
  (pDVar16->semi).kind = TVar12;
  (pDVar16->semi).field_0x2 = uVar13;
  (pDVar16->semi).numFlags = (NumericTokenFlags)NVar14.raw;
  (pDVar16->semi).rawLen = uVar15;
  (pDVar16->semi).info = pIVar3;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pDVar16;
  return pDVar16;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }